

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O3

void conv_direct(double *inp1,int N,double *inp2,int L,double *oup)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  iVar1 = N + L + -1;
  if (N < L) {
    if (0 < N) {
      lVar4 = 1;
      uVar5 = 0;
      pdVar3 = inp1;
      do {
        oup[uVar5] = 0.0;
        dVar9 = 0.0;
        lVar7 = 0;
        pdVar6 = pdVar3;
        do {
          dVar9 = dVar9 + inp2[lVar7] * *pdVar6;
          oup[uVar5] = dVar9;
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6 + -1;
        } while (lVar4 != lVar7);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + 1;
      } while (uVar5 != (uint)N);
    }
    if (N < iVar1) {
      lVar4 = (long)N;
      pdVar3 = inp1 + lVar4;
      lVar7 = 1;
      iVar1 = 0;
      do {
        oup[lVar4] = 0.0;
        dVar10 = (double)(iVar1 + 1);
        dVar9 = (double)N + dVar10;
        if ((double)L <= dVar9) {
          dVar9 = (double)L;
        }
        if (dVar10 < dVar9) {
          dVar10 = 0.0;
          lVar2 = lVar7;
          pdVar6 = pdVar3;
          do {
            pdVar6 = pdVar6 + -1;
            dVar10 = dVar10 + inp2[lVar2] * *pdVar6;
            lVar2 = lVar2 + 1;
            oup[lVar4] = dVar10;
          } while ((double)(int)lVar2 < dVar9);
        }
        lVar4 = lVar4 + 1;
        lVar7 = lVar7 + 1;
        bVar8 = iVar1 != L + -2;
        iVar1 = iVar1 + 1;
      } while (bVar8);
    }
  }
  else {
    if (0 < L) {
      lVar4 = 1;
      uVar5 = 0;
      pdVar3 = inp2;
      do {
        oup[uVar5] = 0.0;
        dVar9 = 0.0;
        lVar7 = 0;
        pdVar6 = pdVar3;
        do {
          dVar9 = dVar9 + inp1[lVar7] * *pdVar6;
          oup[uVar5] = dVar9;
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6 + -1;
        } while (lVar4 != lVar7);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + 1;
      } while (uVar5 != (uint)L);
    }
    if (L < iVar1) {
      lVar4 = (long)L;
      pdVar3 = inp2 + lVar4;
      iVar1 = 0;
      lVar7 = 1;
      do {
        oup[lVar4] = 0.0;
        iVar1 = iVar1 + 1;
        dVar9 = (double)L + (double)iVar1;
        if ((double)N <= dVar9) {
          dVar9 = (double)N;
        }
        if ((double)iVar1 < dVar9) {
          dVar10 = 0.0;
          lVar2 = lVar7;
          pdVar6 = pdVar3;
          do {
            pdVar6 = pdVar6 + -1;
            dVar10 = dVar10 + inp1[lVar2] * *pdVar6;
            lVar2 = lVar2 + 1;
            oup[lVar4] = dVar10;
          } while ((double)(int)lVar2 < dVar9);
        }
        lVar4 = lVar4 + 1;
        lVar7 = lVar7 + 1;
      } while (iVar1 != N + -1);
    }
  }
  return;
}

Assistant:

void conv_direct(fft_type *inp1,int N, fft_type *inp2, int L,fft_type *oup) {

	int M,k,m,i;
	fft_type t1,tmin;

	M = N + L -1;
	i = 0;

	if (N >= L) {

		for (k = 0; k < L; k++) {
			oup[k] = 0.0;
			for (m = 0; m <= k;m++) {
				oup[k]+= inp1[m] * inp2[k-m];
			}
		}

		for (k = L; k < M; k++) {
			oup[k] = 0.0;
			i++;
			t1 = (fft_type) L + i;
			tmin = MIN(t1,N);
			for (m = i; m < tmin;m++) {
				oup[k]+= inp1[m] * inp2[k-m];
			}
		}


	} else {
		for (k = 0; k < N; k++) {
			oup[k] = 0.0;
			for (m = 0; m <= k;m++) {
				oup[k]+= inp2[m] * inp1[k-m];
			}
		}

		for (k = N; k < M; k++) {
			oup[k] = 0.0;
			i++;
			t1 = (fft_type) N + i;
			tmin = MIN(t1,L);
			for (m = i; m < tmin;m++) {
				oup[k]+= inp2[m] * inp1[k-m];
			}
		}

	}


}